

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunction * duckdb::PiFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  LogicalType local_88 [24];
  undefined1 local_70 [48];
  LogicalType local_40 [24];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xdc91c0);
  duckdb::LogicalType::LogicalType(local_40,DOUBLE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  duckdb::LogicalType::LogicalType(local_88,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,&local_28,local_40,local_70,0,0,0,0,local_88,0,0,0);
  duckdb::LogicalType::~LogicalType(local_88);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xdc9261);
  duckdb::LogicalType::~LogicalType(local_40);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdc927b);
  return in_RDI;
}

Assistant:

ScalarFunction PiFun::GetFunction() {
	return ScalarFunction({}, LogicalType::DOUBLE, PiFunction);
}